

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::SetProperty_Internal<false>
               (Var receiver,RecyclableObject *object,bool isRoot,PropertyId propertyId,Var newValue
               ,PropertyValueInfo *info,ScriptContext *requestContext,
               PropertyOperationFlags propertyOperationFlags)

{
  Type TVar1;
  Type *typeWithoutProperty;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  ulong uVar8;
  BOOL local_4c;
  Var pvStack_48;
  BOOL setAccessorResult;
  long *local_40;
  uint local_34;
  
  if (receiver == (Var)0x0) {
    return 0;
  }
  pvStack_48 = newValue;
  local_34 = propertyId;
  bVar3 = VarIs<Js::RecyclableObject>(receiver);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    local_40 = (long *)receiver;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xae1,"(!TaggedNumber::Is(receiver))","!TaggedNumber::Is(receiver)"
                               );
    if (!bVar3) goto LAB_00ac328b;
    *puVar6 = 0;
    receiver = local_40;
  }
  local_4c = 0;
  local_40 = (long *)(ulong)isRoot;
  bVar3 = SetAccessorOrNonWritableProperty
                    (receiver,object,local_34,pvStack_48,info,requestContext,propertyOperationFlags,
                     isRoot,false,&local_4c);
  if (bVar3) {
    return local_4c;
  }
  BVar4 = IsObject(receiver);
  if (BVar4 == 0) {
    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
    return 0;
  }
  typeWithoutProperty = (object->type).ptr;
  if (!isRoot) {
    pRVar7 = VarTo<Js::RecyclableObject>(receiver);
    if (((pRVar7->type).ptr)->typeId == TypeIds_Null) {
      return 0;
    }
    iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x17])
                      (pRVar7,(ulong)local_34,pvStack_48,(ulong)propertyOperationFlags,info);
    goto LAB_00ac31fa;
  }
  uVar8 = (ulong)receiver & 0xffff000000000000;
  if (((ulong)receiver & 0x1ffff00000000) == 0x1000000000000 || uVar8 != 0x1000000000000) {
    if ((ulong)receiver >> 0x32 != 0 || uVar8 == 0x1000000000000) {
LAB_00ac30e4:
      if (receiver < (long *)0x4000000000000 && uVar8 != 0x1000000000000) {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(receiver);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00ac328b;
          *puVar6 = 0;
        }
        TVar1 = ((pRVar7->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_LastTrueJavascriptObjectType) goto LAB_00ac31dd;
        }
        else {
          BVar4 = RecyclableObject::IsExternal(pRVar7);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            fileName = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
            ;
            error = "(typeId < TypeIds_Limit || obj->IsExternal())";
            message = "GetTypeId aValue has invalid TypeId";
            lineNumber = 0xe;
            goto LAB_00ac2f91;
          }
        }
      }
      goto LAB_00ac3189;
    }
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(receiver);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00ac328b;
      *puVar6 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar4 = RecyclableObject::IsExternal(pRVar7);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00ac328b;
        *puVar6 = 0;
      }
      goto LAB_00ac30e4;
    }
    if (TVar1 != TypeIds_GlobalObject) goto LAB_00ac30e4;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00ac328b;
    *puVar6 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00ac2f91:
    bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar3) goto LAB_00ac328b;
    *puVar6 = 0;
LAB_00ac3189:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xafa,
                                "(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot)"
                                ,"Root must be a global object!");
    if (!bVar3) {
LAB_00ac328b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_00ac31dd:
  iVar5 = (**(code **)(*receiver + 0x370))(receiver,local_34,pvStack_48,propertyOperationFlags,info)
  ;
LAB_00ac31fa:
  if (iVar5 == 0) {
    return 0;
  }
  bVar3 = VarIs<Js::JavascriptProxy>(receiver);
  if (!bVar3) {
    pRVar7 = VarTo<Js::RecyclableObject>(receiver);
    CacheOperators::CachePropertyWrite
              (pRVar7,SUB81(local_40,0),typeWithoutProperty,local_34,info,requestContext);
    return 1;
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::SetProperty_Internal(Var receiver, RecyclableObject* object, const bool isRoot, PropertyId propertyId, Var newValue, PropertyValueInfo * info, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags)
    {
        if (receiver == nullptr)
        {
            return FALSE;
        }

        Assert(!TaggedNumber::Is(receiver));
        BOOL setAccessorResult = FALSE;
        if (SetAccessorOrNonWritableProperty(receiver, object, propertyId, newValue, info, requestContext, propertyOperationFlags, isRoot, false, &setAccessorResult))
        {
            return setAccessorResult;
        }
        else if (!JavascriptOperators::IsObject(receiver))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
            return FALSE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Break on mutation if needed
        bool doNotUpdateCacheForMbp = MutationBreakpoint::IsFeatureEnabled(requestContext) ?
            MutationBreakpoint::HandleSetProperty(requestContext, object, propertyId, newValue) : false;
#endif

        // Get the original type before setting the property
        Type *typeWithoutProperty = object->GetType();
        BOOL didSetProperty = false;
        if (isRoot)
        {
            AssertMsg(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject
                || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot,
                "Root must be a global object!");

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(receiver);
            didSetProperty = rootObject->SetRootProperty(propertyId, newValue, propertyOperationFlags, info);
        }
        else
        {
            RecyclableObject* instanceObject = VarTo<RecyclableObject>(receiver);
            while (!JavascriptOperators::IsNull(instanceObject))
            {
                if (unscopables && JavascriptOperators::IsPropertyUnscopable(instanceObject, propertyId))
                {
                    break;
                }
                else
                {
                    didSetProperty = instanceObject->SetProperty(propertyId, newValue, propertyOperationFlags, info);
                    if (didSetProperty || !unscopables)
                    {
                        break;
                    }
                }
                instanceObject = JavascriptOperators::GetPrototypeNoTrap(instanceObject);
            }
        }

        if (didSetProperty)
        {
            bool updateCache = true;
#ifdef ENABLE_MUTATION_BREAKPOINT
            updateCache = updateCache && !doNotUpdateCacheForMbp;
#endif

            if (updateCache)
            {
                if (!VarIs<JavascriptProxy>(receiver))
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), isRoot, typeWithoutProperty, propertyId, info, requestContext);
                }
            }
            return TRUE;
        }

        return FALSE;
    }